

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O0

void Abc_SclLinkCells(SC_Lib *p)

{
  int iVar1;
  SC_Cell *pSVar2;
  Vec_Wrd_t *p1;
  Vec_Wrd_t *p2;
  void **ppvVar3;
  Vec_Ptr_t *p_00;
  void *Entry;
  void *pvVar4;
  void *pvVar5;
  int local_30;
  int local_2c;
  int k;
  int i;
  SC_Cell *pRepr;
  SC_Cell *pCell;
  Vec_Ptr_t *vList;
  SC_Lib *p_local;
  
  _k = (SC_Cell *)0x0;
  iVar1 = Vec_PtrSize(&p->vCellClasses);
  if (iVar1 != 0) {
    __assert_fail("Vec_PtrSize(&p->vCellClasses) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLibUtil.c"
                  ,0x10b,"void Abc_SclLinkCells(SC_Lib *)");
  }
  local_2c = 0;
  do {
    iVar1 = Vec_PtrSize(&p->vCells);
    if (iVar1 <= local_2c) {
      ppvVar3 = Vec_PtrArray(&p->vCellClasses);
      iVar1 = Vec_PtrSize(&p->vCellClasses);
      qsort(ppvVar3,(long)iVar1,8,Abc_SclCompareCells);
      p_00 = Vec_PtrAlloc(100);
      for (local_30 = 0; iVar1 = Vec_PtrSize(&p->vCellClasses), local_30 < iVar1;
          local_30 = local_30 + 1) {
        pSVar2 = (SC_Cell *)Vec_PtrEntry(&p->vCellClasses,local_30);
        Vec_PtrClear(p_00);
        pRepr = pSVar2;
        for (local_2c = 0; local_2c == 0 || pRepr != pSVar2; local_2c = local_2c + 1) {
          Vec_PtrPush(p_00,pRepr);
          pRepr = pRepr->pNext;
        }
        ppvVar3 = Vec_PtrArray(p_00);
        iVar1 = Vec_PtrSize(p_00);
        qsort(ppvVar3,(long)iVar1,8,Abc_SclCompareCells);
        Entry = Vec_PtrEntry(p_00,0);
        *(void **)((long)Entry + 0x50) = Entry;
        *(void **)((long)Entry + 0x48) = Entry;
        *(void **)((long)Entry + 0x58) = Entry;
        iVar1 = Vec_PtrSize(p_00);
        pvVar4 = Vec_PtrEntry(p_00,iVar1 / 2);
        *(void **)((long)Entry + 0x60) = pvVar4;
        *(undefined4 *)((long)Entry + 0x68) = 0;
        iVar1 = Vec_PtrSize(p_00);
        *(int *)((long)Entry + 0x6c) = iVar1;
        for (local_2c = 1; iVar1 = Vec_PtrSize(p_00), local_2c < iVar1; local_2c = local_2c + 1) {
          pvVar4 = Vec_PtrEntry(p_00,local_2c);
          *(void **)(*(long *)((long)Entry + 0x50) + 0x48) = pvVar4;
          *(void **)((long)pvVar4 + 0x48) = Entry;
          *(undefined8 *)((long)pvVar4 + 0x50) = *(undefined8 *)((long)Entry + 0x50);
          *(void **)((long)Entry + 0x50) = pvVar4;
          *(void **)((long)pvVar4 + 0x58) = Entry;
          iVar1 = Vec_PtrSize(p_00);
          pvVar5 = Vec_PtrEntry(p_00,iVar1 / 2);
          *(void **)((long)pvVar4 + 0x60) = pvVar5;
          *(int *)((long)pvVar4 + 0x68) = local_2c;
          iVar1 = Vec_PtrSize(p_00);
          *(int *)((long)pvVar4 + 0x6c) = iVar1;
        }
        Vec_PtrWriteEntry(&p->vCellClasses,local_30,Entry);
      }
      Vec_PtrFree(p_00);
      return;
    }
    pSVar2 = (SC_Cell *)Vec_PtrEntry(&p->vCells,local_2c);
    for (local_30 = 0; iVar1 = Vec_PtrSize(&p->vCellClasses), local_30 < iVar1;
        local_30 = local_30 + 1) {
      _k = (SC_Cell *)Vec_PtrEntry(&p->vCellClasses,local_30);
      if ((pSVar2->n_inputs == _k->n_inputs) && (pSVar2->n_outputs == _k->n_outputs)) {
        p1 = SC_CellFunc(pSVar2);
        p2 = SC_CellFunc(_k);
        iVar1 = Vec_WrdEqual(p1,p2);
        if (iVar1 != 0) break;
      }
    }
    iVar1 = Vec_PtrSize(&p->vCellClasses);
    if (local_30 == iVar1) {
      Vec_PtrPush(&p->vCellClasses,pSVar2);
      pSVar2->pPrev = pSVar2;
      pSVar2->pNext = pSVar2;
    }
    else {
      _k->pPrev->pNext = pSVar2;
      pSVar2->pNext = _k;
      pSVar2->pPrev = _k->pPrev;
      _k->pPrev = pSVar2;
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

void Abc_SclLinkCells( SC_Lib * p )
{
    Vec_Ptr_t * vList;
    SC_Cell * pCell, * pRepr = NULL;
    int i, k;
    assert( Vec_PtrSize(&p->vCellClasses) == 0 );
    SC_LibForEachCell( p, pCell, i )
    {
        // find gate with the same function
        SC_LibForEachCellClass( p, pRepr, k )
            if ( pCell->n_inputs  == pRepr->n_inputs && 
                 pCell->n_outputs == pRepr->n_outputs && 
                 Vec_WrdEqual(SC_CellFunc(pCell), SC_CellFunc(pRepr)) )
                break;
        if ( k == Vec_PtrSize(&p->vCellClasses) )
        {
            Vec_PtrPush( &p->vCellClasses, pCell );
            pCell->pNext = pCell->pPrev = pCell;
            continue;
        }
        // add it to the list before the cell
        pRepr->pPrev->pNext = pCell; pCell->pNext = pRepr;
        pCell->pPrev = pRepr->pPrev; pRepr->pPrev = pCell;
    }
    // sort cells by size then by name
    qsort( (void *)Vec_PtrArray(&p->vCellClasses), Vec_PtrSize(&p->vCellClasses), sizeof(void *), (int(*)(const void *,const void *))Abc_SclCompareCells );
    // sort cell lists
    vList = Vec_PtrAlloc( 100 );
    SC_LibForEachCellClass( p, pRepr, k )
    {
        Vec_PtrClear( vList );
        SC_RingForEachCell( pRepr, pCell, i )
            Vec_PtrPush( vList, pCell );
        qsort( (void *)Vec_PtrArray(vList), Vec_PtrSize(vList), sizeof(void *), (int(*)(const void *,const void *))Abc_SclCompareCells );
        // create new representative
        pRepr = (SC_Cell *)Vec_PtrEntry( vList, 0 );
        pRepr->pNext = pRepr->pPrev = pRepr;
        pRepr->pRepr = pRepr;
        pRepr->pAve  = (SC_Cell *)Vec_PtrEntry( vList, Vec_PtrSize(vList)/2 );
        pRepr->Order = 0;
        pRepr->nGates = Vec_PtrSize(vList);
        // relink cells
        Vec_PtrForEachEntryStart( SC_Cell *, vList, pCell, i, 1 )
        {
            pRepr->pPrev->pNext = pCell; pCell->pNext = pRepr;
            pCell->pPrev = pRepr->pPrev; pRepr->pPrev = pCell;
            pCell->pRepr = pRepr;
            pCell->pAve  = (SC_Cell *)Vec_PtrEntry( vList, Vec_PtrSize(vList)/2 );
            pCell->Order = i;
            pCell->nGates = Vec_PtrSize(vList);
        }
        // update list
        Vec_PtrWriteEntry( &p->vCellClasses, k, pRepr );
    }
    Vec_PtrFree( vList );
}